

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void lj_dispatch_ins(lua_State *L,BCIns *pc)

{
  int iVar1;
  long lVar2;
  BCIns *pBVar3;
  uint64_t uVar4;
  BCReg BVar5;
  uint uVar6;
  BCLine line_00;
  BCLine BVar7;
  int *piVar8;
  GCproto *pt_00;
  uint32_t *puVar9;
  bool bVar10;
  BCLine line;
  BCPos opc;
  BCPos npc;
  jit_State *J;
  BCReg slots;
  global_State *g;
  BCIns *oldpc;
  void *cf;
  GCproto *pt;
  GCfunc *fn;
  int olderr;
  BCIns *pc_local;
  lua_State *L_local;
  
  piVar8 = __errno_location();
  iVar1 = *piVar8;
  lVar2 = *(long *)((L->base[-2].u64 & 0x7fffffffffff) + 0x20);
  pt_00 = (GCproto *)(lVar2 + -0x68);
  puVar9 = (uint32_t *)((ulong)L->cframe & 0xfffffffffffffffc);
  pBVar3 = *(BCIns **)(puVar9 + 6);
  uVar4 = (L->glref).ptr64;
  *(BCIns **)(puVar9 + 6) = pc;
  BVar5 = cur_topslot(pt_00,pc,*puVar9);
  L->top = L->base + BVar5;
  if (*(int *)(uVar4 + 0x3cc) != 0) {
    *(lua_State **)(uVar4 + 0x360) = L;
    lj_trace_ins((jit_State *)(uVar4 + 0x2e0),pc + -1);
  }
  if (((*(byte *)(uVar4 + 0x91) & 8) != 0) && (*(int *)(uVar4 + 0x148) == 0)) {
    *(undefined4 *)(uVar4 + 0x148) = *(undefined4 *)(uVar4 + 0x14c);
    callhook(L,3,-1);
    L->top = L->base + BVar5;
  }
  if ((*(byte *)(uVar4 + 0x91) & 4) != 0) {
    uVar6 = (int)((long)pBVar3 - lVar2 >> 2) - 1;
    line_00 = lj_debug_line(pt_00,(int)((long)pc - lVar2 >> 2) - 1);
    if (((pc <= pBVar3) || (*(uint *)(lVar2 + -0x5c) <= uVar6)) ||
       (BVar7 = lj_debug_line(pt_00,uVar6), line_00 != BVar7)) {
      callhook(L,2,line_00);
      L->top = L->base + BVar5;
    }
  }
  if ((*(byte *)(uVar4 + 0x91) & 2) != 0) {
    uVar6 = pc[-1] & 0xff;
    bVar10 = true;
    if (((uVar6 != 0x49) && (bVar10 = true, uVar6 != 0x4a)) && (bVar10 = true, uVar6 != 0x4b)) {
      bVar10 = uVar6 == 0x4c;
    }
    if (bVar10) {
      callhook(L,1,-1);
    }
  }
  piVar8 = __errno_location();
  *piVar8 = iVar1;
  return;
}

Assistant:

void LJ_FASTCALL lj_dispatch_ins(lua_State *L, const BCIns *pc)
{
  ERRNO_SAVE
  GCfunc *fn = curr_func(L);
  GCproto *pt = funcproto(fn);
  void *cf = cframe_raw(L->cframe);
  const BCIns *oldpc = cframe_pc(cf);
  global_State *g = G(L);
  BCReg slots;
  setcframe_pc(cf, pc);
  slots = cur_topslot(pt, pc, cframe_multres_n(cf));
  L->top = L->base + slots;  /* Fix top. */
#if LJ_HASJIT
  {
    jit_State *J = G2J(g);
    if (J->state != LJ_TRACE_IDLE) {
#ifdef LUA_USE_ASSERT
      ptrdiff_t delta = L->top - L->base;
#endif
      J->L = L;
      lj_trace_ins(J, pc-1);  /* The interpreter bytecode PC is offset by 1. */
      lj_assertG(L->top - L->base == delta,
		 "unbalanced stack after tracing of instruction");
    }
  }
#endif
  if ((g->hookmask & LUA_MASKCOUNT) && g->hookcount == 0) {
    g->hookcount = g->hookcstart;
    callhook(L, LUA_HOOKCOUNT, -1);
    L->top = L->base + slots;  /* Fix top again. */
  }
  if ((g->hookmask & LUA_MASKLINE)) {
    BCPos npc = proto_bcpos(pt, pc) - 1;
    BCPos opc = proto_bcpos(pt, oldpc) - 1;
    BCLine line = lj_debug_line(pt, npc);
    if (pc <= oldpc || opc >= pt->sizebc || line != lj_debug_line(pt, opc)) {
      callhook(L, LUA_HOOKLINE, line);
      L->top = L->base + slots;  /* Fix top again. */
    }
  }
  if ((g->hookmask & LUA_MASKRET) && bc_isret(bc_op(pc[-1])))
    callhook(L, LUA_HOOKRET, -1);
  ERRNO_RESTORE
}